

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::set_external_address
          (session_impl *this,endpoint *param_1,address *ip,ip_source_t source_type,address *source)

{
  bool bVar1;
  reference sock_00;
  __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  local_58;
  endpoint *local_50;
  shared_ptr<libtorrent::aux::listen_socket_t> *local_48;
  __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  local_40;
  __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  local_38;
  __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  sock;
  address *source_local;
  address *ip_local;
  endpoint *local_endpoint_local;
  session_impl *this_local;
  ip_source_t source_type_local;
  
  sock._M_current = (shared_ptr<libtorrent::aux::listen_socket_t> *)source;
  local_40._M_current =
       (shared_ptr<libtorrent::aux::listen_socket_t> *)
       ::std::
       vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
       ::begin(&this->m_listen_sockets);
  local_48 = (shared_ptr<libtorrent::aux::listen_socket_t> *)
             ::std::
             vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
             ::end(&this->m_listen_sockets);
  local_50 = param_1;
  local_38 = ::std::
             find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>*,std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>>>>,libtorrent::aux::session_impl::set_external_address(boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,boost::asio::ip::address_const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::ip_source_tag,void>,boost::asio::ip::address_const&)::__0>
                       (local_40,(__normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
                                  )local_48,(anon_class_8_1_c3cffa27_for__M_pred)param_1);
  local_58._M_current =
       (shared_ptr<libtorrent::aux::listen_socket_t> *)
       ::std::
       vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
       ::end(&this->m_listen_sockets);
  bVar1 = __gnu_cxx::operator!=(&local_38,&local_58);
  if (bVar1) {
    sock_00 = __gnu_cxx::
              __normal_iterator<std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
              ::operator*(&local_38);
    set_external_address(this,sock_00,ip,source_type,(address *)sock._M_current);
  }
  return;
}

Assistant:

void session_impl::set_external_address(
		tcp::endpoint const& local_endpoint, address const& ip
		, ip_source_t const source_type, address const& source)
	{
		auto sock = std::find_if(m_listen_sockets.begin(), m_listen_sockets.end()
			, [&](std::shared_ptr<listen_socket_t> const& v)
			{ return v->local_endpoint.address() == local_endpoint.address(); });

		if (sock != m_listen_sockets.end())
			set_external_address(*sock, ip, source_type, source);
	}